

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_search_start(bitstream *str)

{
  vs_type vVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int unaff_R12D;
  bool bVar6;
  int bit;
  uint32_t local_2c;
  
  if (str->dir == VS_DECODE) {
    vVar1 = str->type;
    if ((vVar1 & ~VS_H263) == VS_H261) {
      do {
        if (str->hasbyte == 0) {
          bVar6 = false;
          iVar3 = 0;
          if (str->bytepos < str->bytesnum) goto LAB_00102070;
        }
        else {
LAB_00102070:
          if (str->zero_bits < (int)(0x10 - (uint)(vVar1 == VS_H261))) {
            iVar3 = vs_bit(str,&local_2c);
            bVar6 = iVar3 == 0;
            iVar3 = unaff_R12D;
            if (!bVar6) {
              iVar3 = 0;
            }
          }
          else {
            bVar6 = false;
            iVar3 = 1;
          }
        }
        unaff_R12D = iVar3;
      } while (bVar6);
    }
    else {
      str->hasbyte = 0;
      str->bitpos = 7;
      iVar3 = str->bytepos;
      lVar4 = (long)iVar3;
      if (iVar3 < str->bytesnum) {
        iVar5 = str->zero_bytes;
        do {
          iVar3 = iVar3 + 1;
          if ((iVar5 == 2) && (str->bytes[lVar4] == '\x01')) {
            return 1;
          }
          iVar2 = 0;
          if (str->bytes[lVar4] == '\0') {
            if (iVar5 != 2) {
              iVar2 = iVar5 + 1;
              goto LAB_001020e4;
            }
          }
          else {
LAB_001020e4:
            iVar5 = iVar2;
            str->zero_bytes = iVar5;
          }
          lVar4 = lVar4 + 1;
          str->bytepos = iVar3;
        } while (iVar3 != str->bytesnum);
      }
      iVar3 = 0;
    }
  }
  else {
    vs_search_start_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int vs_search_start(struct bitstream *str) {
	if (str->dir != VS_DECODE) {
		fprintf (stderr, "vs_search_start called in encode mode!\n");
		return -1;
	}
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		while (1) {
			int bit;
			if (!str->hasbyte && str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bits >= nzbit)
				return 1;
			if (vs_bit(str, &bit)) return 0;
		}
	} else {
		str->hasbyte = 0;
		str->bitpos = 7;
		while (1) {
			if (str->bytepos >= str->bytesnum)
				return 0;
			if (str->zero_bytes == 2 && str->bytes[str->bytepos] == 1)
				return 1;
			if (str->bytes[str->bytepos] == 0) {
				if (str->zero_bytes != 2)
					str->zero_bytes++;
			} else {
				str->zero_bytes = 0;
			}
			str->bytepos++;
		}
	}
}